

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O3

void __thiscall
fasttext::Args::parseArgs
          (Args *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  logic_error *plVar6;
  ostream *poVar7;
  pointer pbVar8;
  ulong uVar9;
  string *psVar10;
  _Alloc_hider _Var11;
  ulong uVar12;
  int *piVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  float fVar15;
  undefined1 auVar16 [12];
  out_of_range anon_var_0;
  string command;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  string *local_a8;
  string *local_a0;
  string *local_98;
  string *local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_70[0] = local_60;
  pcVar1 = pbVar8[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + pbVar8[1]._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)local_70);
  if (iVar2 == 0) {
    this->loss = softmax;
    this->model = sup;
    this->minCount = 1;
    this->minn = 0;
    this->maxn = 0;
    this->lr = 0.1;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)local_70);
    if (iVar2 == 0) {
      this->model = cbow;
    }
  }
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x41) {
LAB_00122e5e:
    if (((this->input)._M_string_length != 0) && ((this->output)._M_string_length != 0)) {
      if ((this->wordNgrams < 2) &&
         ((this->maxn == 0 && ((this->autotuneValidationFile)._M_string_length == 0)))) {
        this->bucket = 0;
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      return;
    }
LAB_00122f77:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Empty input or output path.",0x1b);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    printHelp(this);
LAB_00123210:
    exit(1);
  }
  iVar2 = 2;
  uVar12 = 2;
  local_a0 = (string *)&this->autotuneMetric;
  local_98 = (string *)&this->autotuneValidationFile;
  local_a8 = (string *)&this->autotuneModelSize;
  local_90 = (string *)&this->pretrainedVectors;
  local_88 = (string *)&this->label;
  local_80 = (string *)&this->output;
  local_78 = (string *)&this->input;
LAB_00121eb5:
  if (*pbVar8[uVar12]._M_dataplus._M_p != '-') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Provided argument without a dash! Usage:",0x28);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    printHelp(this);
    goto LAB_00123210;
  }
  std::__cxx11::string::substr((ulong)local_c8,(ulong)(pbVar8 + uVar12));
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_M_emplace<std::__cxx11::string_const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)this,(string *)local_c8);
  if (local_c8[0] != &local_b8) {
    operator_delete(local_c8[0]);
  }
  iVar3 = std::__cxx11::string::compare
                    ((char *)((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar12));
  if (iVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Here is the help! Usage:",0x18);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    printHelp(this);
    goto LAB_00123210;
  }
  iVar3 = std::__cxx11::string::compare
                    ((char *)((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar12));
  if (iVar3 == 0) {
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (ulong)(iVar2 + 1);
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= uVar12) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00122f39:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00122f47:
      std::__throw_invalid_argument("stof");
LAB_00122f53:
      std::__throw_invalid_argument("stoi");
LAB_00122f5f:
      std::__throw_out_of_range("stoi");
LAB_00122f6b:
      std::__throw_out_of_range("stof");
      goto LAB_00122f77;
    }
    pcVar1 = pbVar8[uVar12]._M_dataplus._M_p;
    local_c8[0] = &local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,pcVar1,pcVar1 + pbVar8[uVar12]._M_string_length);
    psVar10 = local_78;
LAB_00122323:
    std::__cxx11::string::operator=(psVar10,(string *)local_c8);
    if (local_c8[0] != &local_b8) {
      operator_delete(local_c8[0]);
    }
LAB_001227ec:
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar2 = iVar2 + 2;
    uVar12 = (ulong)iVar2;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= uVar12)
    goto LAB_00122e5e;
    goto LAB_00121eb5;
  }
  iVar3 = std::__cxx11::string::compare
                    ((char *)((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar12));
  if (iVar3 == 0) {
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (ulong)(iVar2 + 1);
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= uVar12)
    goto LAB_00122f39;
    pcVar1 = pbVar8[uVar12]._M_dataplus._M_p;
    local_c8[0] = &local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,pcVar1,pcVar1 + pbVar8[uVar12]._M_string_length);
    psVar10 = local_80;
    goto LAB_00122323;
  }
  iVar3 = std::__cxx11::string::compare
                    ((char *)((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar12));
  if (iVar3 == 0) {
    piVar13 = (int *)(long)(iVar2 + 1);
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((int *)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= piVar13)
    goto LAB_00123091;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pbVar8[(long)piVar13]._M_dataplus._M_p;
    piVar13 = __errno_location();
    iVar3 = *piVar13;
    *piVar13 = 0;
    fVar15 = strtof(paVar14->_M_local_buf,(char **)local_c8);
    if (local_c8[0] == paVar14) goto LAB_00122f47;
    if (*piVar13 == 0) {
      *piVar13 = iVar3;
    }
    else if (*piVar13 == 0x22) goto LAB_00122f6b;
    this->lr = (double)fVar15;
    goto LAB_001227ec;
  }
  iVar3 = std::__cxx11::string::compare
                    ((char *)((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar12));
  if (iVar3 == 0) {
    piVar13 = (int *)(long)(iVar2 + 1);
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (piVar13 < (int *)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)) {
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pbVar8[(long)piVar13]._M_dataplus._M_p;
      piVar13 = __errno_location();
      iVar3 = *piVar13;
      *piVar13 = 0;
      lVar4 = strtol(paVar14->_M_local_buf,(char **)local_c8,10);
      if (local_c8[0] == paVar14) goto LAB_00122f53;
      if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar13 != 0x22)) {
        if (*piVar13 == 0) {
          *piVar13 = iVar3;
        }
        this->lrUpdateRate = (int)lVar4;
        goto LAB_001227ec;
      }
      goto LAB_00122f5f;
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar12));
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar3 == 0) {
        piVar13 = (int *)(long)(iVar2 + 1);
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (piVar13 < (int *)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)
           ) {
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pbVar8[(long)piVar13]._M_dataplus._M_p;
          piVar13 = __errno_location();
          iVar3 = *piVar13;
          *piVar13 = 0;
          lVar4 = strtol(paVar14->_M_local_buf,(char **)local_c8,10);
          if (local_c8[0] != paVar14) {
            if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar13 != 0x22)) {
              if (*piVar13 == 0) {
                *piVar13 = iVar3;
              }
              this->ws = (int)lVar4;
              goto LAB_001227ec;
            }
            goto LAB_00122fc2;
          }
          goto LAB_00122fce;
        }
        goto LAB_00123091;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar3 == 0) {
        piVar13 = (int *)(long)(iVar2 + 1);
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((int *)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
            piVar13) goto LAB_00123091;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pbVar8[(long)piVar13]._M_dataplus._M_p;
        piVar13 = __errno_location();
        iVar3 = *piVar13;
        *piVar13 = 0;
        lVar4 = strtol(paVar14->_M_local_buf,(char **)local_c8,10);
        if (local_c8[0] != paVar14) {
          if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar13 != 0x22)) {
            if (*piVar13 == 0) {
              *piVar13 = iVar3;
            }
            this->epoch = (int)lVar4;
            goto LAB_001227ec;
          }
          goto LAB_00122fda;
        }
        goto LAB_00122fe6;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar3 == 0) {
        piVar13 = (int *)(long)(iVar2 + 1);
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((int *)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
            piVar13) goto LAB_00123091;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pbVar8[(long)piVar13]._M_dataplus._M_p;
        piVar13 = __errno_location();
        iVar3 = *piVar13;
        *piVar13 = 0;
        lVar4 = strtol(paVar14->_M_local_buf,(char **)local_c8,10);
        if (local_c8[0] != paVar14) {
          if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar13 != 0x22)) {
            if (*piVar13 == 0) {
              *piVar13 = iVar3;
            }
            this->minCount = (int)lVar4;
            goto LAB_001227ec;
          }
          goto LAB_00122ff2;
        }
        goto LAB_00122ffe;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar3 == 0) {
        piVar13 = (int *)(long)(iVar2 + 1);
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((int *)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
            piVar13) goto LAB_00123091;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pbVar8[(long)piVar13]._M_dataplus._M_p;
        piVar13 = __errno_location();
        iVar3 = *piVar13;
        *piVar13 = 0;
        lVar4 = strtol(paVar14->_M_local_buf,(char **)local_c8,10);
        if (local_c8[0] != paVar14) {
          if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar13 != 0x22)) {
            if (*piVar13 == 0) {
              *piVar13 = iVar3;
            }
            this->minCountLabel = (int)lVar4;
            goto LAB_001227ec;
          }
          goto LAB_0012300a;
        }
        goto LAB_00123016;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar3 == 0) {
        piVar13 = (int *)(long)(iVar2 + 1);
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (piVar13 < (int *)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)
           ) {
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pbVar8[(long)piVar13]._M_dataplus._M_p;
          piVar13 = __errno_location();
          iVar3 = *piVar13;
          *piVar13 = 0;
          lVar4 = strtol(paVar14->_M_local_buf,(char **)local_c8,10);
          if (local_c8[0] != paVar14) {
            if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar13 != 0x22)) {
              if (*piVar13 == 0) {
                *piVar13 = iVar3;
              }
              this->neg = (int)lVar4;
              goto LAB_001227ec;
            }
            goto LAB_00123022;
          }
          goto LAB_0012302e;
        }
        goto LAB_00123091;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar3 == 0) {
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        piVar13 = (int *)(long)(iVar2 + 1);
        if (piVar13 < (int *)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)
           ) {
          iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar13,(size_t *)0x0,10);
          this->wordNgrams = iVar3;
          goto LAB_001227ec;
        }
        goto LAB_00123091;
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar13 = (int *)(long)(iVar2 + 1);
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar13) goto LAB_00123091;
          iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar13,(size_t *)0x0,10);
          this->bucket = iVar3;
          goto LAB_001227ec;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar13 = (int *)(long)(iVar2 + 1);
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar13) goto LAB_00123091;
          iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar13,(size_t *)0x0,10);
          this->minn = iVar3;
          goto LAB_001227ec;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar13 = (int *)(long)(iVar2 + 1);
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar13) goto LAB_00123091;
          iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar13,(size_t *)0x0,10);
          this->maxn = iVar3;
          goto LAB_001227ec;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar13 = (int *)(long)(iVar2 + 1);
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar13) goto LAB_00123091;
          iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar13,(size_t *)0x0,10);
          this->thread = iVar3;
          goto LAB_001227ec;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar13 = (int *)(long)(iVar2 + 1);
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar13) goto LAB_00123091;
          fVar15 = std::__cxx11::stof(pbVar8 + (long)piVar13,(size_t *)0x0);
          this->t = (double)fVar15;
          goto LAB_001227ec;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar9 = (ulong)(iVar2 + 1);
          if (uVar9 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)
             ) {
            pcVar1 = pbVar8[uVar9]._M_dataplus._M_p;
            local_c8[0] = &local_b8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_c8,pcVar1,pcVar1 + pbVar8[uVar9]._M_string_length);
            psVar10 = local_88;
            goto LAB_00122323;
          }
          goto LAB_001230a2;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar13 = (int *)(long)(iVar2 + 1);
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar13) goto LAB_00123091;
          iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar13,(size_t *)0x0,10);
          this->verbose = iVar3;
          goto LAB_001227ec;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar9 = (ulong)(iVar2 + 1);
          if (uVar9 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)
             ) {
            pcVar1 = pbVar8[uVar9]._M_dataplus._M_p;
            local_c8[0] = &local_b8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_c8,pcVar1,pcVar1 + pbVar8[uVar9]._M_string_length);
            psVar10 = local_90;
            goto LAB_00122323;
          }
          goto LAB_001230b0;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar3 == 0) {
          iVar2 = iVar2 + -1;
          this->saveOutput = true;
          goto LAB_001227ec;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar13 = (int *)(long)(iVar2 + 1);
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar13) goto LAB_00123091;
          iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar13,(size_t *)0x0,10);
          this->seed = iVar3;
          goto LAB_001227ec;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar3 == 0) {
          iVar2 = iVar2 + -1;
          this->qnorm = true;
          goto LAB_001227ec;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar3 == 0) {
          iVar2 = iVar2 + -1;
          this->retrain = true;
          goto LAB_001227ec;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar3 == 0) {
          iVar2 = iVar2 + -1;
          this->qout = true;
          goto LAB_001227ec;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar13 = (int *)(long)(iVar2 + 1);
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar13) goto LAB_00123091;
          iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar13,(size_t *)0x0,10);
          this->cutoff = (long)iVar3;
          goto LAB_001227ec;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar3 == 0) {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar13 = (int *)(long)(iVar2 + 1);
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar13) goto LAB_00123091;
          iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar13,(size_t *)0x0,10);
          this->dsub = (long)iVar3;
          goto LAB_001227ec;
        }
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12));
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12));
          if (iVar3 == 0) {
            pbVar8 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar9 = (ulong)(iVar2 + 1);
            if (uVar9 < (ulong)((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >>
                               5)) {
              local_c8[0] = &local_b8;
              pcVar1 = pbVar8[uVar9]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_c8,pcVar1,pcVar1 + pbVar8[uVar9]._M_string_length);
              std::__cxx11::string::operator=(local_a0,(string *)local_c8);
              if (local_c8[0] != &local_b8) {
                operator_delete(local_c8[0]);
              }
              getAutotuneMetric(this);
              getAutotuneMetricLabel_abi_cxx11_(&local_50,this);
              paVar14 = &local_50.field_2;
              _Var11._M_p = local_50._M_dataplus._M_p;
              goto LAB_00122db6;
            }
            goto LAB_00123121;
          }
          iVar3 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12));
          if (iVar3 == 0) {
            pbVar8 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            piVar13 = (int *)(long)(iVar2 + 1);
            if ((int *)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
                piVar13) goto LAB_00123091;
            iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar13,(size_t *)0x0,10);
            this->autotunePredictions = iVar3;
            goto LAB_001227ec;
          }
          iVar3 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12));
          if (iVar3 == 0) {
            pbVar8 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            piVar13 = (int *)(long)(iVar2 + 1);
            if ((int *)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
                piVar13) goto LAB_00123091;
            iVar3 = std::__cxx11::stoi(pbVar8 + (long)piVar13,(size_t *)0x0,10);
            this->autotuneDuration = iVar3;
            goto LAB_001227ec;
          }
          iVar3 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12));
          if (iVar3 == 0) {
            pbVar8 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar9 = (ulong)(iVar2 + 1);
            if (uVar9 < (ulong)((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >>
                               5)) {
              local_c8[0] = &local_b8;
              pcVar1 = pbVar8[uVar9]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_c8,pcVar1,pcVar1 + pbVar8[uVar9]._M_string_length);
              psVar10 = local_a8;
              goto LAB_00122d0a;
            }
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            goto LAB_00123113;
          }
          goto LAB_001230be;
        }
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar9 = (ulong)(iVar2 + 1);
        if (uVar9 < (ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5))
        {
          local_c8[0] = &local_b8;
          pcVar1 = pbVar8[uVar9]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_c8,pcVar1,pcVar1 + pbVar8[uVar9]._M_string_length);
          psVar10 = local_98;
LAB_00122d0a:
          std::__cxx11::string::operator=(psVar10,(string *)local_c8);
          paVar14 = &local_b8;
          _Var11._M_p = (pointer)local_c8[0];
LAB_00122db6:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var11._M_p != paVar14) {
            operator_delete(_Var11._M_p);
          }
          goto LAB_001227ec;
        }
LAB_00123113:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00123121:
        auVar16 = std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
        uVar5 = auVar16._0_8_;
        if (auVar16._8_4_ != 1) {
          if (local_70[0] != local_60) {
            operator_delete(local_70[0]);
          }
          _Unwind_Resume(uVar5);
        }
        plVar6 = (logic_error *)__cxa_get_exception_ptr(uVar5);
        std::logic_error::logic_error((logic_error *)local_c8,plVar6);
        local_c8[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)operator_delete;
        __cxa_begin_catch(uVar5);
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,pbVar8[uVar12]._M_dataplus._M_p,
                            pbVar8[uVar12]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," is missing an argument",0x17);
        std::endl<char,std::char_traits<char>>(poVar7);
        printHelp(this);
        goto LAB_00123210;
      }
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar13 = (int *)(long)(iVar2 + 1);
      if ((int *)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= piVar13)
      goto LAB_00123091;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)piVar13 * 0x20);
      iVar3 = std::__cxx11::string::compare(paVar14->_M_local_buf + (long)pbVar8);
      if (iVar3 == 0) {
        this->loss = hs;
      }
      else {
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((int *)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
            piVar13) goto LAB_00123091;
        iVar3 = std::__cxx11::string::compare(paVar14->_M_local_buf + (long)pbVar8);
        if (iVar3 == 0) {
          this->loss = ns;
        }
        else {
          pbVar8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((int *)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
              piVar13) goto LAB_00123091;
          iVar3 = std::__cxx11::string::compare(paVar14->_M_local_buf + (long)pbVar8);
          if (iVar3 == 0) {
            this->loss = softmax;
          }
          else {
            pbVar8 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((int *)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
                piVar13) goto LAB_00123091;
            iVar3 = std::__cxx11::string::compare(paVar14->_M_local_buf + (long)pbVar8);
            if (iVar3 != 0) {
              pbVar8 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if ((int *)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
                  piVar13) goto LAB_00123091;
              iVar3 = std::__cxx11::string::compare(paVar14->_M_local_buf + (long)pbVar8);
              if (iVar3 != 0) goto LAB_0012303a;
            }
            this->loss = ova;
          }
        }
      }
      goto LAB_001227ec;
    }
    piVar13 = (int *)(long)(iVar2 + 1);
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((int *)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <= piVar13)
    goto LAB_00123091;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pbVar8[(long)piVar13]._M_dataplus._M_p;
    piVar13 = __errno_location();
    iVar3 = *piVar13;
    *piVar13 = 0;
    lVar4 = strtol(paVar14->_M_local_buf,(char **)local_c8,10);
    if (local_c8[0] != paVar14) {
      if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar13 != 0x22)) {
        if (*piVar13 == 0) {
          *piVar13 = iVar3;
        }
        this->dim = (int)lVar4;
        goto LAB_001227ec;
      }
      std::__throw_out_of_range("stoi");
    }
    std::__throw_invalid_argument("stoi");
LAB_00122fc2:
    std::__throw_out_of_range("stoi");
LAB_00122fce:
    std::__throw_invalid_argument("stoi");
LAB_00122fda:
    std::__throw_out_of_range("stoi");
LAB_00122fe6:
    std::__throw_invalid_argument("stoi");
LAB_00122ff2:
    std::__throw_out_of_range("stoi");
LAB_00122ffe:
    std::__throw_invalid_argument("stoi");
LAB_0012300a:
    std::__throw_out_of_range("stoi");
LAB_00123016:
    std::__throw_invalid_argument("stoi");
LAB_00123022:
    std::__throw_out_of_range("stoi");
LAB_0012302e:
    std::__throw_invalid_argument("stoi");
LAB_0012303a:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Unknown loss: ",0xe);
    pbVar8 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (piVar13 < (int *)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,*(char **)(paVar14->_M_local_buf + (long)pbVar8),
                          *(long *)(paVar14->_M_local_buf + (long)&pbVar8->_M_string_length));
      std::endl<char,std::char_traits<char>>(poVar7);
      printHelp(this);
      goto LAB_00123210;
    }
  }
LAB_00123091:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",piVar13);
LAB_001230a2:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001230b0:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001230be:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Unknown argument: ",0x12);
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,pbVar8[uVar12]._M_dataplus._M_p,
                      pbVar8[uVar12]._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar7);
  printHelp(this);
  goto LAB_00123210;
}

Assistant:

void Args::parseArgs(const std::vector<std::string>& args) {
  std::string command(args[1]);
  if (command == "supervised") {
    model = model_name::sup;
    loss = loss_name::softmax;
    minCount = 1;
    minn = 0;
    maxn = 0;
    lr = 0.1;
  } else if (command == "cbow") {
    model = model_name::cbow;
  }
  for (int ai = 2; ai < args.size(); ai += 2) {
    if (args[ai][0] != '-') {
      std::cerr << "Provided argument without a dash! Usage:" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
    try {
      setManual(args[ai].substr(1));

      if (args[ai] == "-h") {
        std::cerr << "Here is the help! Usage:" << std::endl;
        printHelp();
        exit(EXIT_FAILURE);
      } else if (args[ai] == "-input") {
        input = std::string(args.at(ai + 1));
      } else if (args[ai] == "-output") {
        output = std::string(args.at(ai + 1));
      } else if (args[ai] == "-lr") {
        lr = std::stof(args.at(ai + 1));
      } else if (args[ai] == "-lrUpdateRate") {
        lrUpdateRate = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-dim") {
        dim = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-ws") {
        ws = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-epoch") {
        epoch = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minCount") {
        minCount = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minCountLabel") {
        minCountLabel = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-neg") {
        neg = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-wordNgrams") {
        wordNgrams = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-loss") {
        if (args.at(ai + 1) == "hs") {
          loss = loss_name::hs;
        } else if (args.at(ai + 1) == "ns") {
          loss = loss_name::ns;
        } else if (args.at(ai + 1) == "softmax") {
          loss = loss_name::softmax;
        } else if (
            args.at(ai + 1) == "one-vs-all" || args.at(ai + 1) == "ova") {
          loss = loss_name::ova;
        } else {
          std::cerr << "Unknown loss: " << args.at(ai + 1) << std::endl;
          printHelp();
          exit(EXIT_FAILURE);
        }
      } else if (args[ai] == "-bucket") {
        bucket = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minn") {
        minn = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-maxn") {
        maxn = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-thread") {
        thread = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-t") {
        t = std::stof(args.at(ai + 1));
      } else if (args[ai] == "-label") {
        label = std::string(args.at(ai + 1));
      } else if (args[ai] == "-verbose") {
        verbose = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-pretrainedVectors") {
        pretrainedVectors = std::string(args.at(ai + 1));
      } else if (args[ai] == "-saveOutput") {
        saveOutput = true;
        ai--;
      } else if (args[ai] == "-seed") {
        seed = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-qnorm") {
        qnorm = true;
        ai--;
      } else if (args[ai] == "-retrain") {
        retrain = true;
        ai--;
      } else if (args[ai] == "-qout") {
        qout = true;
        ai--;
      } else if (args[ai] == "-cutoff") {
        cutoff = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-dsub") {
        dsub = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-autotune-validation") {
        autotuneValidationFile = std::string(args.at(ai + 1));
      } else if (args[ai] == "-autotune-metric") {
        autotuneMetric = std::string(args.at(ai + 1));
        getAutotuneMetric(); // throws exception if not able to parse
        getAutotuneMetricLabel(); // throws exception if not able to parse
      } else if (args[ai] == "-autotune-predictions") {
        autotunePredictions = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-autotune-duration") {
        autotuneDuration = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-autotune-modelsize") {
        autotuneModelSize = std::string(args.at(ai + 1));
      } else {
        std::cerr << "Unknown argument: " << args[ai] << std::endl;
        printHelp();
        exit(EXIT_FAILURE);
      }
    } catch (std::out_of_range) {
      std::cerr << args[ai] << " is missing an argument" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
  }
  if (input.empty() || output.empty()) {
    std::cerr << "Empty input or output path." << std::endl;
    printHelp();
    exit(EXIT_FAILURE);
  }
  if (wordNgrams <= 1 && maxn == 0 && !hasAutotune()) {
    bucket = 0;
  }
}